

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_foreach::run_impl(statement_foreach *this)

{
  context_t *context;
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined *puVar3;
  runtime_error *this_00;
  undefined1 local_40 [8];
  undefined1 local_38 [32];
  
  local_38._0_8_ = (this->mObj).mRoot;
  runtime_type::parse_expr
            ((runtime_type *)local_40,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(local_38,0));
  if (local_40 == (undefined1  [8])0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*(*(baseHolder **)((long)local_40 + 0x10))->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  context = &(this->super_statement_base).context;
  pcVar1 = *(char **)(puVar3 + 8);
  if (pcVar1 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
LAB_002b7806:
    foreach_helper<std::__cxx11::string,char>(context,&this->mIt,(var *)local_40,&this->mBlock);
    goto LAB_002b79d1;
  }
  if (*pcVar1 != '*') {
    iVar2 = strcmp(pcVar1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
    if (iVar2 == 0) goto LAB_002b7806;
  }
  if (local_40 == (undefined1  [8])0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*(*(baseHolder **)((long)local_40 + 0x10))->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var_00,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if (pcVar1 == "NSt7__cxx114listIN7cs_impl3anyESaIS2_EEE") {
LAB_002b7862:
    foreach_helper<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
              (context,&this->mIt,(var *)local_40,&this->mBlock);
    goto LAB_002b79d1;
  }
  if (*pcVar1 != '*') {
    iVar2 = strcmp(pcVar1,"NSt7__cxx114listIN7cs_impl3anyESaIS2_EEE");
    if (iVar2 == 0) goto LAB_002b7862;
  }
  if (local_40 == (undefined1  [8])0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*(*(baseHolder **)((long)local_40 + 0x10))->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var_01,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if (pcVar1 == "St5dequeIN7cs_impl3anyESaIS1_EE") {
LAB_002b78be:
    foreach_helper<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
              (context,&this->mIt,(var *)local_40,&this->mBlock);
    goto LAB_002b79d1;
  }
  if (*pcVar1 != '*') {
    iVar2 = strcmp(pcVar1,"St5dequeIN7cs_impl3anyESaIS1_EE");
    if (iVar2 == 0) goto LAB_002b78be;
  }
  if (local_40 == (undefined1  [8])0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*(*(baseHolder **)((long)local_40 + 0x10))->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var_02,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if (pcVar1 == "N5phmap13flat_hash_setIN7cs_impl3anyENS_4HashIS2_EENS_7EqualToIS2_EESaIS2_EEE") {
LAB_002b791a:
    foreach_helper<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>,cs_impl::any>
              (context,&this->mIt,(var *)local_40,&this->mBlock);
    goto LAB_002b79d1;
  }
  if (*pcVar1 != '*') {
    iVar2 = strcmp(pcVar1,
                   "N5phmap13flat_hash_setIN7cs_impl3anyENS_4HashIS2_EENS_7EqualToIS2_EESaIS2_EEE");
    if (iVar2 == 0) goto LAB_002b791a;
  }
  if (local_40 == (undefined1  [8])0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*(*(baseHolder **)((long)local_40 + 0x10))->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var_03,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if (pcVar1 == 
      "N5phmap13flat_hash_mapIN7cs_impl3anyES2_NS_4HashIS2_EENS_7EqualToIS2_EESaISt4pairIKS2_S2_EEEE"
     ) {
LAB_002b7976:
    foreach_helper<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>,std::pair<cs_impl::any,cs_impl::any>>
              (context,&this->mIt,(var *)local_40,&this->mBlock);
  }
  else {
    if (*pcVar1 != '*') {
      iVar2 = strcmp(pcVar1,
                     "N5phmap13flat_hash_mapIN7cs_impl3anyES2_NS_4HashIS2_EENS_7EqualToIS2_EESaISt4pairIKS2_S2_EEEE"
                    );
      if (iVar2 == 0) goto LAB_002b7976;
    }
    if (local_40 == (undefined1  [8])0x0) {
      puVar3 = &void::typeinfo;
    }
    else {
      iVar2 = (*(*(baseHolder **)((long)local_40 + 0x10))->_vptr_baseHolder[2])();
      puVar3 = (undefined *)CONCAT44(extraout_var_04,iVar2);
    }
    pcVar1 = *(char **)(puVar3 + 8);
    if (pcVar1 != "N2cs10range_typeE") {
      if (*pcVar1 == '*') {
LAB_002b79e5:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_38._0_8_ = local_38 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_38,"Unsupported type(foreach)","");
        runtime_error::runtime_error(this_00,(string *)local_38);
        __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      iVar2 = strcmp(pcVar1,"N2cs10range_typeE");
      if (iVar2 != 0) goto LAB_002b79e5;
    }
    foreach_helper<cs::range_type,cs::numeric>(context,&this->mIt,(var *)local_40,&this->mBlock);
  }
LAB_002b79d1:
  cs_impl::any::recycle((any *)local_40);
  return;
}

Assistant:

void statement_foreach::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		const var &obj = context->instance->parse_expr(this->mObj.root());
		if (obj.type() == typeid(string))
			foreach_helper<string, char>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(list))
			foreach_helper<list, var>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(array))
			foreach_helper<array, var>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(hash_set))
			foreach_helper<hash_set, var>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(hash_map))
			foreach_helper<hash_map, pair>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(range_type))
			foreach_helper<range_type, numeric>(context, this->mIt, obj, this->mBlock);
		else
			throw runtime_error("Unsupported type(foreach)");
	}